

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

BrandedDecl * __thiscall
capnp::compiler::NodeTranslator::BrandScope::decompileType
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,Reader type)

{
  int *piVar1;
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  Reader type_00;
  Reader subSource;
  undefined4 uVar2;
  Which WVar3;
  Which WVar4;
  uint16_t uVar5;
  uint64_t uVar6;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *pNVar7;
  BrandedDecl *pBVar8;
  ResolvedParameter variable;
  Fault local_c50;
  Fault f;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_c00;
  undefined1 local_b50 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> binding;
  uint index;
  uint64_t id;
  Reader param;
  Reader anyPointer;
  Reader local_a28;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_9f0;
  BrandedDecl local_9d8;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_930;
  undefined1 local_880 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> _kj_result;
  Reader local_720;
  Reader local_6f0;
  undefined1 local_6c0 [8];
  BrandedDecl elementType;
  Reader local_5e8;
  Reader local_5b8;
  ResolvedDecl local_588;
  undefined1 local_528 [112];
  undefined1 local_4b8 [8];
  ResolvedDecl decl_2;
  Reader structType;
  Reader local_3f8;
  Reader local_3c8;
  ResolvedDecl local_398;
  undefined1 local_338 [112];
  undefined1 local_2c8 [8];
  ResolvedDecl decl_1;
  Reader interfaceType;
  Reader local_200;
  Reader local_1d0;
  ResolvedDecl local_1a0;
  undefined1 local_140 [128];
  undefined1 local_c0 [8];
  ResolvedDecl decl;
  Reader enumType;
  anon_class_16_2_36210f71 builtin;
  Resolver *resolver_local;
  BrandScope *this_local;
  
  enumType._reader._40_8_ = resolver;
  WVar3 = capnp::schema::Type::Reader::which(&type);
  switch(WVar3) {
  case VOID:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_VOID);
    break;
  case BOOL:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_BOOL);
    break;
  case INT8:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_INT8);
    break;
  case INT16:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_INT16);
    break;
  case INT32:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_INT32);
    break;
  case INT64:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_INT64);
    break;
  case UINT8:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_U_INT8);
    break;
  case UINT16:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_U_INT16);
    break;
  case UINT32:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_U_INT32);
    break;
  case UINT64:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_U_INT64);
    break;
  case FLOAT32:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_FLOAT32);
    break;
  case FLOAT64:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_FLOAT64);
    break;
  case TEXT:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_TEXT);
    break;
  case DATA:
    decompileType::anon_class_16_2_36210f71::operator()
              (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
               BUILTIN_DATA);
    break;
  case LIST:
    capnp::schema::Type::Reader::getList(&local_720,&type);
    capnp::schema::Type::List::Reader::getElementType(&local_6f0,&local_720);
    type_00._reader.capTable = local_6f0._reader.capTable;
    type_00._reader.segment = local_6f0._reader.segment;
    type_00._reader.data = local_6f0._reader.data;
    type_00._reader.pointers = local_6f0._reader.pointers;
    type_00._reader.dataSize = local_6f0._reader.dataSize;
    type_00._reader.pointerCount = local_6f0._reader.pointerCount;
    type_00._reader._38_2_ = local_6f0._reader._38_2_;
    type_00._reader.nestingLimit = local_6f0._reader.nestingLimit;
    type_00._reader._44_4_ = local_6f0._reader._44_4_;
    decompileType((BrandedDecl *)local_6c0,this,resolver,type_00);
    decompileType::anon_class_16_2_36210f71::operator()
              (&local_9d8,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,BUILTIN_LIST);
    kj::heapArray<capnp::compiler::NodeTranslator::BrandedDecl>
              (&local_9f0,(BrandedDecl *)local_6c0,1);
    local_a28._reader.dataSize = 0;
    local_a28._reader.pointerCount = 0;
    local_a28._reader._38_2_ = 0;
    local_a28._reader.nestingLimit = 0;
    local_a28._reader._44_4_ = 0;
    local_a28._reader.data = (void *)0x0;
    local_a28._reader.pointers = (WirePointer *)0x0;
    local_a28._reader.segment = (SegmentReader *)0x0;
    local_a28._reader.capTable = (CapTableReader *)0x0;
    Expression::Reader::Reader(&local_a28);
    subSource._reader.capTable = local_a28._reader.capTable;
    subSource._reader.segment = local_a28._reader.segment;
    subSource._reader.data = local_a28._reader.data;
    subSource._reader.pointers = local_a28._reader.pointers;
    subSource._reader.dataSize = local_a28._reader.dataSize;
    subSource._reader.pointerCount = local_a28._reader.pointerCount;
    subSource._reader._38_2_ = local_a28._reader._38_2_;
    subSource._reader.nestingLimit = local_a28._reader.nestingLimit;
    subSource._reader._44_4_ = local_a28._reader._44_4_;
    BrandedDecl::applyParams(&local_930,&local_9d8,&local_9f0,subSource);
    pNVar7 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_930);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_880,pNVar7);
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_930);
    kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array(&local_9f0);
    BrandedDecl::~BrandedDecl(&local_9d8);
    pBVar8 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_880);
    if (pBVar8 == (BrandedDecl *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&anyPointer._reader.nestingLimit,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x4bd,FAILED,
                 "builtin(Declaration::BUILTIN_LIST) .applyParams(kj::heapArray(&elementType, 1), Expression::Reader()) != nullptr"
                 ,"");
      kj::_::Debug::Fault::fatal((Fault *)&anyPointer._reader.nestingLimit);
    }
    pNVar7 = kj::mv<kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>>
                       ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_880);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
               &_kj_result.field_1.value.source._reader.nestingLimit,pNVar7);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_880);
    pBVar8 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                       ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                        &_kj_result.field_1.value.source._reader.nestingLimit);
    BrandedDecl::BrandedDecl(__return_storage_ptr__,pBVar8);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
               &_kj_result.field_1.value.source._reader.nestingLimit);
    BrandedDecl::~BrandedDecl((BrandedDecl *)local_6c0);
    break;
  case ENUM:
    piVar1 = &decl.brand.ptr.field_1.value._reader.nestingLimit;
    capnp::schema::Type::Reader::getEnum((Reader *)piVar1,&type);
    uVar6 = capnp::schema::Type::Enum::Reader::getTypeId((Reader *)piVar1);
    (*resolver->_vptr_Resolver[3])((ResolvedDecl *)local_c0,resolver,uVar6);
    Resolver::ResolvedDecl::ResolvedDecl
              ((ResolvedDecl *)(local_140 + 0x20),(ResolvedDecl *)local_c0);
    Resolver::ResolvedDecl::ResolvedDecl(&local_1a0,(ResolvedDecl *)local_c0);
    capnp::schema::Type::Enum::Reader::getBrand
              (&local_200,(Reader *)&decl.brand.ptr.field_1.value._reader.nestingLimit);
    capnp::schema::Brand::Reader::getScopes(&local_1d0,&local_200);
    brand.reader.capTable = local_1d0.reader.capTable;
    brand.reader.segment = local_1d0.reader.segment;
    brand.reader.ptr = local_1d0.reader.ptr;
    brand.reader.elementCount = local_1d0.reader.elementCount;
    brand.reader.step = local_1d0.reader.step;
    brand.reader.structDataSize = local_1d0.reader.structDataSize;
    brand.reader.structPointerCount = local_1d0.reader.structPointerCount;
    brand.reader.elementSize = local_1d0.reader.elementSize;
    brand.reader._39_1_ = local_1d0.reader._39_1_;
    brand.reader.nestingLimit = local_1d0.reader.nestingLimit;
    brand.reader._44_4_ = local_1d0.reader._44_4_;
    evaluateBrand((BrandScope *)local_140,(Resolver *)this,(ResolvedDecl *)resolver,brand,
                  (uint)&local_1a0);
    interfaceType._reader.nestingLimit = 0;
    interfaceType._reader._44_4_ = 0;
    Expression::Reader::Reader((Reader *)&interfaceType._reader.nestingLimit);
    BrandedDecl::BrandedDecl
              (__return_storage_ptr__,(ResolvedDecl *)(local_140 + 0x20),
               (Own<capnp::compiler::NodeTranslator::BrandScope> *)local_140,
               (Reader)ZEXT848((ulong)interfaceType._reader._40_8_));
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
              ((Own<capnp::compiler::NodeTranslator::BrandScope> *)local_140);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_1a0);
    Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)(local_140 + 0x20));
    Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)local_c0);
    break;
  case STRUCT:
    piVar1 = &decl_2.brand.ptr.field_1.value._reader.nestingLimit;
    capnp::schema::Type::Reader::getStruct((Reader *)piVar1,&type);
    uVar6 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)piVar1);
    (*resolver->_vptr_Resolver[3])((ResolvedDecl *)local_4b8,resolver,uVar6);
    Resolver::ResolvedDecl::ResolvedDecl
              ((ResolvedDecl *)(local_528 + 0x10),(ResolvedDecl *)local_4b8);
    Resolver::ResolvedDecl::ResolvedDecl(&local_588,(ResolvedDecl *)local_4b8);
    capnp::schema::Type::Struct::Reader::getBrand
              (&local_5e8,(Reader *)&decl_2.brand.ptr.field_1.value._reader.nestingLimit);
    capnp::schema::Brand::Reader::getScopes(&local_5b8,&local_5e8);
    brand_01.reader.capTable = local_5b8.reader.capTable;
    brand_01.reader.segment = local_5b8.reader.segment;
    brand_01.reader.ptr = local_5b8.reader.ptr;
    brand_01.reader.elementCount = local_5b8.reader.elementCount;
    brand_01.reader.step = local_5b8.reader.step;
    brand_01.reader.structDataSize = local_5b8.reader.structDataSize;
    brand_01.reader.structPointerCount = local_5b8.reader.structPointerCount;
    brand_01.reader.elementSize = local_5b8.reader.elementSize;
    brand_01.reader._39_1_ = local_5b8.reader._39_1_;
    brand_01.reader.nestingLimit = local_5b8.reader.nestingLimit;
    brand_01.reader._44_4_ = local_5b8.reader._44_4_;
    evaluateBrand((BrandScope *)local_528,(Resolver *)this,(ResolvedDecl *)resolver,brand_01,
                  (uint)&local_588);
    elementType.source._reader.nestingLimit = 0;
    elementType.source._reader._44_4_ = 0;
    Expression::Reader::Reader((Reader *)&elementType.source._reader.nestingLimit);
    BrandedDecl::BrandedDecl
              (__return_storage_ptr__,(ResolvedDecl *)(local_528 + 0x10),
               (Own<capnp::compiler::NodeTranslator::BrandScope> *)local_528,
               (Reader)ZEXT848((ulong)elementType.source._reader._40_8_));
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
              ((Own<capnp::compiler::NodeTranslator::BrandScope> *)local_528);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_588);
    Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)(local_528 + 0x10));
    Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)local_4b8);
    break;
  case INTERFACE:
    piVar1 = &decl_1.brand.ptr.field_1.value._reader.nestingLimit;
    capnp::schema::Type::Reader::getInterface((Reader *)piVar1,&type);
    uVar6 = capnp::schema::Type::Interface::Reader::getTypeId((Reader *)piVar1);
    (*resolver->_vptr_Resolver[3])((ResolvedDecl *)local_2c8,resolver,uVar6);
    Resolver::ResolvedDecl::ResolvedDecl
              ((ResolvedDecl *)(local_338 + 0x10),(ResolvedDecl *)local_2c8);
    Resolver::ResolvedDecl::ResolvedDecl(&local_398,(ResolvedDecl *)local_2c8);
    capnp::schema::Type::Interface::Reader::getBrand
              (&local_3f8,(Reader *)&decl_1.brand.ptr.field_1.value._reader.nestingLimit);
    capnp::schema::Brand::Reader::getScopes(&local_3c8,&local_3f8);
    brand_00.reader.capTable = local_3c8.reader.capTable;
    brand_00.reader.segment = local_3c8.reader.segment;
    brand_00.reader.ptr = local_3c8.reader.ptr;
    brand_00.reader.elementCount = local_3c8.reader.elementCount;
    brand_00.reader.step = local_3c8.reader.step;
    brand_00.reader.structDataSize = local_3c8.reader.structDataSize;
    brand_00.reader.structPointerCount = local_3c8.reader.structPointerCount;
    brand_00.reader.elementSize = local_3c8.reader.elementSize;
    brand_00.reader._39_1_ = local_3c8.reader._39_1_;
    brand_00.reader.nestingLimit = local_3c8.reader.nestingLimit;
    brand_00.reader._44_4_ = local_3c8.reader._44_4_;
    evaluateBrand((BrandScope *)local_338,(Resolver *)this,(ResolvedDecl *)resolver,brand_00,
                  (uint)&local_398);
    structType._reader.nestingLimit = 0;
    structType._reader._44_4_ = 0;
    Expression::Reader::Reader((Reader *)&structType._reader.nestingLimit);
    BrandedDecl::BrandedDecl
              (__return_storage_ptr__,(ResolvedDecl *)(local_338 + 0x10),
               (Own<capnp::compiler::NodeTranslator::BrandScope> *)local_338,
               (Reader)ZEXT848((ulong)structType._reader._40_8_));
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own
              ((Own<capnp::compiler::NodeTranslator::BrandScope> *)local_338);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_398);
    Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)(local_338 + 0x10));
    Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)local_2c8);
    break;
  case ANY_POINTER:
    piVar1 = &param._reader.nestingLimit;
    capnp::schema::Type::Reader::getAnyPointer((Reader *)piVar1,&type);
    WVar4 = capnp::schema::Type::AnyPointer::Reader::which((Reader *)piVar1);
    if (WVar4 == UNCONSTRAINED) {
      decompileType::anon_class_16_2_36210f71::operator()
                (__return_storage_ptr__,(anon_class_16_2_36210f71 *)&enumType._reader.nestingLimit,
                 BUILTIN_ANY_POINTER);
    }
    else {
      if (WVar4 != PARAMETER) {
        if (WVar4 == IMPLICIT_METHOD_PARAMETER) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                    (&local_c50,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x4d2,FAILED,(char *)0x0,
                     "\"Alias pointed to implicit method type parameter?\"",
                     (char (*) [49])"Alias pointed to implicit method type parameter?");
          kj::_::Debug::Fault::fatal(&local_c50);
        }
        kj::_::unreachable();
      }
      capnp::schema::Type::AnyPointer::Reader::getParameter
                ((Reader *)&id,(Reader *)&param._reader.nestingLimit);
      uVar6 = capnp::schema::Type::AnyPointer::Parameter::Reader::getScopeId((Reader *)&id);
      uVar5 = capnp::schema::Type::AnyPointer::Parameter::Reader::getParameterIndex((Reader *)&id);
      binding.field_1._164_4_ = ZEXT24(uVar5);
      lookupParameter(&local_c00,this,resolver,uVar6,binding.field_1._164_4_);
      pNVar7 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_c00);
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_b50,pNVar7);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_c00);
      pBVar8 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_b50);
      uVar2 = binding.field_1._164_4_;
      if (pBVar8 == (BrandedDecl *)0x0) {
        f.exception = (Exception *)0x0;
        Expression::Reader::Reader((Reader *)&f);
        variable.index = uVar2;
        variable.id = uVar6;
        variable._12_4_ = 0;
        BrandedDecl::BrandedDecl(__return_storage_ptr__,variable,(Reader)ZEXT848(f.exception));
      }
      else {
        pBVar8 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                           ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_b50
                           );
        BrandedDecl::BrandedDecl(__return_storage_ptr__,pBVar8);
      }
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_b50);
    }
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::BrandedDecl NodeTranslator::BrandScope::decompileType(
    Resolver& resolver, schema::Type::Reader type) {
  auto builtin = [&](Declaration::Which which) -> BrandedDecl {
    auto decl = resolver.resolveBuiltin(which);
    return BrandedDecl(decl,
        evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
        Expression::Reader());
  };

  switch (type.which()) {
    case schema::Type::VOID:    return builtin(Declaration::BUILTIN_VOID);
    case schema::Type::BOOL:    return builtin(Declaration::BUILTIN_BOOL);
    case schema::Type::INT8:    return builtin(Declaration::BUILTIN_INT8);
    case schema::Type::INT16:   return builtin(Declaration::BUILTIN_INT16);
    case schema::Type::INT32:   return builtin(Declaration::BUILTIN_INT32);
    case schema::Type::INT64:   return builtin(Declaration::BUILTIN_INT64);
    case schema::Type::UINT8:   return builtin(Declaration::BUILTIN_U_INT8);
    case schema::Type::UINT16:  return builtin(Declaration::BUILTIN_U_INT16);
    case schema::Type::UINT32:  return builtin(Declaration::BUILTIN_U_INT32);
    case schema::Type::UINT64:  return builtin(Declaration::BUILTIN_U_INT64);
    case schema::Type::FLOAT32: return builtin(Declaration::BUILTIN_FLOAT32);
    case schema::Type::FLOAT64: return builtin(Declaration::BUILTIN_FLOAT64);
    case schema::Type::TEXT:    return builtin(Declaration::BUILTIN_TEXT);
    case schema::Type::DATA:    return builtin(Declaration::BUILTIN_DATA);

    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      Resolver::ResolvedDecl decl = resolver.resolveId(enumType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, enumType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      Resolver::ResolvedDecl decl = resolver.resolveId(interfaceType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, interfaceType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      Resolver::ResolvedDecl decl = resolver.resolveId(structType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, structType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::LIST: {
      auto elementType = decompileType(resolver, type.getList().getElementType());
      return KJ_ASSERT_NONNULL(builtin(Declaration::BUILTIN_LIST)
          .applyParams(kj::heapArray(&elementType, 1), Expression::Reader()));
    }

    case schema::Type::ANY_POINTER: {
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return builtin(Declaration::BUILTIN_ANY_POINTER);

        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          auto id = param.getScopeId();
          uint index = param.getParameterIndex();
          KJ_IF_MAYBE(binding, lookupParameter(resolver, id, index)) {
            return *binding;
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {id, index}, Expression::Reader());
          }
        }

        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          KJ_FAIL_ASSERT("Alias pointed to implicit method type parameter?");
      }

      KJ_UNREACHABLE;
    }
  }